

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestReadStdin::Run(SubprocessTestReadStdin *this)

{
  SubprocessSet *this_00;
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_01;
  size_type sVar4;
  allocator<char> local_41;
  string local_40;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"cat -",&local_41);
  this_01 = SubprocessSet::Add(this_00,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  while (bVar2 = Subprocess::Done(this_01), pTVar1 = g_current_test, !bVar2) {
    SubprocessSet::DoWork(this_00);
  }
  EVar3 = Subprocess::Finish(this_01);
  bVar2 = testing::Test::Check
                    (pTVar1,EVar3 == ExitSuccess,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x104,"ExitSuccess == subproc->Finish()");
  pTVar1 = g_current_test;
  if (bVar2) {
    sVar4 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                      (&(this->super_SubprocessTest).subprocs_.finished_.c);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar4 == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0x105,"1u == subprocs_.finished_.size()");
    if (bVar2) {
      return;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(SubprocessTest, ReadStdin) {
  Subprocess* subproc = subprocs_.Add("cat -");
  while (!subproc->Done()) {
    subprocs_.DoWork();
  }
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_EQ(1u, subprocs_.finished_.size());
}